

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::copy
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  Constructable *__ilast;
  Constructable *in_R8;
  
  if (this->len == 0) {
    __ilast = (Constructable *)0x0;
  }
  else {
    __ilast = (Constructable *)BumpAllocator::allocate((BumpAllocator *)dst,this->len << 3,4);
    std::ranges::__uninitialized_copy_fn::
    operator()<const_(anonymous_namespace)::Constructable_*,_const_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
              ((__uninitialized_copy_fn *)this->data_,this->data_ + this->len,__ilast,
               __ilast + this->len,in_R8);
  }
  return (int)__ilast;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }